

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O3

bool IsWitnessStandard(CTransaction *tx,CCoinsViewCache *mapInputs)

{
  pointer pvVar1;
  long lVar2;
  byte *pbVar3;
  bool bVar4;
  bool bVar5;
  Coin *pCVar6;
  ulong uVar7;
  long lVar8;
  pointer pCVar9;
  long *plVar10;
  uint uVar11;
  long lVar12;
  pointer pCVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  int witnessversion;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_98;
  direct_or_indirect local_78;
  uint local_5c;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = CTransaction::IsCoinBase(tx);
  bVar5 = true;
  if (!bVar4) {
    pCVar13 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar9 != pCVar13) {
      uVar14 = 0;
      do {
        if (pCVar13[uVar14].scriptWitness.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            pCVar13[uVar14].scriptWitness.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pCVar6 = CCoinsViewCache::AccessCoin(mapInputs,&pCVar13[uVar14].prevout);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents
                     ,&(pCVar6->out).scriptPubKey.super_CScriptBase);
          bVar4 = CScript::IsPayToAnchor((CScript *)&local_58.indirect_contents);
          if (bVar4) {
LAB_00360432:
            bVar5 = false;
          }
          else {
            bVar4 = CScript::IsPayToScriptHash((CScript *)&local_58.indirect_contents);
            if (bVar4) {
              local_98.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_98.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_98.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_78.indirect_contents.indirect = (char *)&PTR_CheckECDSASignature_006beb00;
              bVar5 = EvalScript(&local_98,
                                 &(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar14].scriptSig,0,
                                 (BaseSignatureChecker *)&local_78,BASE,(ScriptError *)0x0);
              if ((!bVar5) ||
                 (local_98.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_98.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) {
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::~vector(&local_98);
                goto LAB_00360432;
              }
              prevector<28U,_unsigned_char,_unsigned_int,_int>::
              prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_98.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_98.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
              if (0x1c < local_3c) {
                free(local_58.indirect_contents.indirect);
              }
              local_58._20_8_ = CONCAT44(local_78._24_4_,local_78._20_4_);
              local_58._16_4_ = local_78._16_4_;
              local_58.indirect_contents.indirect = local_78.indirect_contents.indirect;
              local_58.indirect_contents.capacity = local_78.indirect_contents.capacity;
              local_58._12_4_ = local_78._12_4_;
              local_3c = local_5c;
              std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::~vector(&local_98);
            }
            local_98.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_98.
                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            local_78.indirect_contents.indirect = (char *)0x0;
            local_78.indirect_contents.capacity = 0;
            local_78._12_4_ = 0;
            local_78._16_4_ = 0;
            local_78._20_4_ = 0;
            bVar5 = CScript::IsWitnessProgram
                              ((CScript *)&local_58.indirect_contents,(int *)&local_98,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
            if (!bVar5) goto LAB_003604c8;
            bVar5 = true;
            if ((int)local_98.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 1) {
              if (!bVar4 && CONCAT44(local_78._12_4_,local_78.indirect_contents.capacity) -
                            local_78._0_8_ == 0x20) {
                pCVar13 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar2 = *(long *)&pCVar13[uVar14].scriptWitness.stack;
                lVar8 = (long)*(pointer *)((long)&pCVar13[uVar14].scriptWitness.stack + 8) - lVar2;
                if ((ulong)((lVar8 >> 3) * -0x5555555555555555) < 2) {
                  if (lVar8 != 0x18) goto LAB_003604c8;
                }
                else {
                  pbVar3 = *(byte **)(lVar2 + -0x18 + lVar8);
                  if ((pbVar3 == *(byte **)(lVar2 + -0x10 + lVar8)) || (*pbVar3 == 0x50))
                  goto LAB_003604c8;
                  if (((*pbVar3 & 0xfe) == 0xc0) && (lVar2 != lVar2 + lVar8 + -0x30)) {
                    lVar12 = 0;
                    do {
                      if (0x50 < (ulong)(*(long *)(lVar2 + 8 + lVar12) - *(long *)(lVar2 + lVar12)))
                      goto LAB_003604c8;
                      lVar12 = lVar12 + 0x18;
                    } while (lVar8 + -0x30 != lVar12);
                  }
                }
              }
            }
            else if (((int)local_98.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == 0) &&
                    (bVar5 = true,
                    CONCAT44(local_78._12_4_,local_78.indirect_contents.capacity) - local_78._0_8_
                    == 0x20)) {
              pCVar13 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pvVar1 = *(pointer *)((long)&pCVar13[uVar14].scriptWitness.stack + 8);
              if ((ulong)((long)*(pointer *)
                                 ((long)&pvVar1[-1].
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl + 8) -
                         *(long *)&pvVar1[-1].
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl) < 0xe11) {
                lVar2 = *(long *)&pCVar13[uVar14].scriptWitness.stack.
                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ;
                uVar7 = ((long)pvVar1 - lVar2 >> 3) * -0x5555555555555555 - 1;
                if (uVar7 < 0x65) {
                  if (uVar7 == 0) {
                    bVar5 = true;
                  }
                  else {
                    plVar10 = (long *)(lVar2 + 8);
                    uVar11 = 1;
                    do {
                      bVar5 = (ulong)(*plVar10 - plVar10[-1]) < 0x51;
                      if (!bVar5) break;
                      plVar10 = plVar10 + 3;
                      bVar4 = uVar11 < (uint)uVar7;
                      uVar11 = uVar11 + 1;
                    } while (bVar4);
                  }
                  goto LAB_003604cf;
                }
              }
LAB_003604c8:
              bVar5 = false;
            }
LAB_003604cf:
            if ((_func_int **)local_78.indirect_contents.indirect != (_func_int **)0x0) {
              operator_delete(local_78.indirect_contents.indirect,
                              CONCAT44(local_78._20_4_,local_78._16_4_) - local_78._0_8_);
            }
          }
          if (0x1c < local_3c) {
            free(local_58.indirect_contents.indirect);
          }
          if (!bVar5) {
            bVar5 = false;
            goto LAB_0036052d;
          }
          pCVar13 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        uVar14 = (ulong)((int)uVar14 + 1);
        uVar7 = ((long)pCVar9 - (long)pCVar13 >> 3) * 0x4ec4ec4ec4ec4ec5;
      } while (uVar14 <= uVar7 && uVar7 - uVar14 != 0);
      bVar5 = true;
    }
  }
LAB_0036052d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool IsWitnessStandard(const CTransaction& tx, const CCoinsViewCache& mapInputs)
{
    if (tx.IsCoinBase())
        return true; // Coinbases are skipped

    for (unsigned int i = 0; i < tx.vin.size(); i++)
    {
        // We don't care if witness for this input is empty, since it must not be bloated.
        // If the script is invalid without witness, it would be caught sooner or later during validation.
        if (tx.vin[i].scriptWitness.IsNull())
            continue;

        const CTxOut &prev = mapInputs.AccessCoin(tx.vin[i].prevout).out;

        // get the scriptPubKey corresponding to this input:
        CScript prevScript = prev.scriptPubKey;

        // witness stuffing detected
        if (prevScript.IsPayToAnchor()) {
            return false;
        }

        bool p2sh = false;
        if (prevScript.IsPayToScriptHash()) {
            std::vector <std::vector<unsigned char> > stack;
            // If the scriptPubKey is P2SH, we try to extract the redeemScript casually by converting the scriptSig
            // into a stack. We do not check IsPushOnly nor compare the hash as these will be done later anyway.
            // If the check fails at this stage, we know that this txid must be a bad one.
            if (!EvalScript(stack, tx.vin[i].scriptSig, SCRIPT_VERIFY_NONE, BaseSignatureChecker(), SigVersion::BASE))
                return false;
            if (stack.empty())
                return false;
            prevScript = CScript(stack.back().begin(), stack.back().end());
            p2sh = true;
        }

        int witnessversion = 0;
        std::vector<unsigned char> witnessprogram;

        // Non-witness program must not be associated with any witness
        if (!prevScript.IsWitnessProgram(witnessversion, witnessprogram))
            return false;

        // Check P2WSH standard limits
        if (witnessversion == 0 && witnessprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            if (tx.vin[i].scriptWitness.stack.back().size() > MAX_STANDARD_P2WSH_SCRIPT_SIZE)
                return false;
            size_t sizeWitnessStack = tx.vin[i].scriptWitness.stack.size() - 1;
            if (sizeWitnessStack > MAX_STANDARD_P2WSH_STACK_ITEMS)
                return false;
            for (unsigned int j = 0; j < sizeWitnessStack; j++) {
                if (tx.vin[i].scriptWitness.stack[j].size() > MAX_STANDARD_P2WSH_STACK_ITEM_SIZE)
                    return false;
            }
        }

        // Check policy limits for Taproot spends:
        // - MAX_STANDARD_TAPSCRIPT_STACK_ITEM_SIZE limit for stack item size
        // - No annexes
        if (witnessversion == 1 && witnessprogram.size() == WITNESS_V1_TAPROOT_SIZE && !p2sh) {
            // Taproot spend (non-P2SH-wrapped, version 1, witness program size 32; see BIP 341)
            Span stack{tx.vin[i].scriptWitness.stack};
            if (stack.size() >= 2 && !stack.back().empty() && stack.back()[0] == ANNEX_TAG) {
                // Annexes are nonstandard as long as no semantics are defined for them.
                return false;
            }
            if (stack.size() >= 2) {
                // Script path spend (2 or more stack elements after removing optional annex)
                const auto& control_block = SpanPopBack(stack);
                SpanPopBack(stack); // Ignore script
                if (control_block.empty()) return false; // Empty control block is invalid
                if ((control_block[0] & TAPROOT_LEAF_MASK) == TAPROOT_LEAF_TAPSCRIPT) {
                    // Leaf version 0xc0 (aka Tapscript, see BIP 342)
                    for (const auto& item : stack) {
                        if (item.size() > MAX_STANDARD_TAPSCRIPT_STACK_ITEM_SIZE) return false;
                    }
                }
            } else if (stack.size() == 1) {
                // Key path spend (1 stack element after removing optional annex)
                // (no policy rules apply)
            } else {
                // 0 stack elements; this is already invalid by consensus rules
                return false;
            }
        }
    }
    return true;
}